

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.c
# Opt level: O0

size_t FSE_count_parallel_wksp
                 (uint *count,uint *maxSymbolValuePtr,void *source,size_t sourceSize,uint checkMax,
                 uint *workSpace)

{
  U32 UVar1;
  U32 UVar2;
  long in_RCX;
  ulong uVar3;
  void *in_RDX;
  uint *in_RSI;
  void *in_RDI;
  int in_R8D;
  void *in_R9;
  U32 s_1;
  U32 s;
  U32 c;
  U32 cached;
  U32 *Counting4;
  U32 *Counting3;
  U32 *Counting2;
  U32 *Counting1;
  uint max;
  uint maxSymbolValue;
  BYTE *iend;
  BYTE *ip;
  uint local_80;
  uint local_7c;
  uint local_74;
  uint local_50;
  uint local_4c;
  byte *local_40;
  ulong local_8;
  
  local_4c = *in_RSI;
  local_50 = 0;
  memset(in_R9,0,0x1000);
  if (in_RCX == 0) {
    memset(in_RDI,0,(ulong)(local_4c + 1));
    *in_RSI = 0;
    local_8 = 0;
  }
  else {
    if (local_4c == 0) {
      local_4c = 0xff;
    }
    local_74 = MEM_read32(in_RDX);
    local_40 = (byte *)((long)in_RDX + 4);
    while (local_40 < (byte *)((long)in_RDX + in_RCX) + -0xf) {
      UVar1 = MEM_read32(local_40);
      *(int *)((long)in_R9 + (ulong)(local_74 & 0xff) * 4) =
           *(int *)((long)in_R9 + (ulong)(local_74 & 0xff) * 4) + 1;
      uVar3 = (ulong)(local_74 >> 8 & 0xff);
      *(int *)((long)in_R9 + uVar3 * 4 + 0x400) = *(int *)((long)in_R9 + uVar3 * 4 + 0x400) + 1;
      uVar3 = (ulong)(local_74 >> 0x10 & 0xff);
      *(int *)((long)in_R9 + uVar3 * 4 + 0x800) = *(int *)((long)in_R9 + uVar3 * 4 + 0x800) + 1;
      *(int *)((long)in_R9 + (ulong)(local_74 >> 0x18) * 4 + 0xc00) =
           *(int *)((long)in_R9 + (ulong)(local_74 >> 0x18) * 4 + 0xc00) + 1;
      UVar2 = MEM_read32(local_40 + 4);
      *(int *)((long)in_R9 + (ulong)(UVar1 & 0xff) * 4) =
           *(int *)((long)in_R9 + (ulong)(UVar1 & 0xff) * 4) + 1;
      uVar3 = (ulong)(UVar1 >> 8 & 0xff);
      *(int *)((long)in_R9 + uVar3 * 4 + 0x400) = *(int *)((long)in_R9 + uVar3 * 4 + 0x400) + 1;
      uVar3 = (ulong)(UVar1 >> 0x10 & 0xff);
      *(int *)((long)in_R9 + uVar3 * 4 + 0x800) = *(int *)((long)in_R9 + uVar3 * 4 + 0x800) + 1;
      *(int *)((long)in_R9 + (ulong)(UVar1 >> 0x18) * 4 + 0xc00) =
           *(int *)((long)in_R9 + (ulong)(UVar1 >> 0x18) * 4 + 0xc00) + 1;
      UVar1 = MEM_read32(local_40 + 8);
      *(int *)((long)in_R9 + (ulong)(UVar2 & 0xff) * 4) =
           *(int *)((long)in_R9 + (ulong)(UVar2 & 0xff) * 4) + 1;
      uVar3 = (ulong)(UVar2 >> 8 & 0xff);
      *(int *)((long)in_R9 + uVar3 * 4 + 0x400) = *(int *)((long)in_R9 + uVar3 * 4 + 0x400) + 1;
      uVar3 = (ulong)(UVar2 >> 0x10 & 0xff);
      *(int *)((long)in_R9 + uVar3 * 4 + 0x800) = *(int *)((long)in_R9 + uVar3 * 4 + 0x800) + 1;
      *(int *)((long)in_R9 + (ulong)(UVar2 >> 0x18) * 4 + 0xc00) =
           *(int *)((long)in_R9 + (ulong)(UVar2 >> 0x18) * 4 + 0xc00) + 1;
      local_74 = MEM_read32(local_40 + 0xc);
      local_40 = local_40 + 0x10;
      *(int *)((long)in_R9 + (ulong)(UVar1 & 0xff) * 4) =
           *(int *)((long)in_R9 + (ulong)(UVar1 & 0xff) * 4) + 1;
      uVar3 = (ulong)(UVar1 >> 8 & 0xff);
      *(int *)((long)in_R9 + uVar3 * 4 + 0x400) = *(int *)((long)in_R9 + uVar3 * 4 + 0x400) + 1;
      uVar3 = (ulong)(UVar1 >> 0x10 & 0xff);
      *(int *)((long)in_R9 + uVar3 * 4 + 0x800) = *(int *)((long)in_R9 + uVar3 * 4 + 0x800) + 1;
      *(int *)((long)in_R9 + (ulong)(UVar1 >> 0x18) * 4 + 0xc00) =
           *(int *)((long)in_R9 + (ulong)(UVar1 >> 0x18) * 4 + 0xc00) + 1;
    }
    local_40 = local_40 + -4;
    while (local_40 < (byte *)((long)in_RDX + in_RCX)) {
      *(int *)((long)in_R9 + (ulong)*local_40 * 4) =
           *(int *)((long)in_R9 + (ulong)*local_40 * 4) + 1;
      local_40 = local_40 + 1;
    }
    if (in_R8D != 0) {
      for (local_7c = 0xff; local_4c < local_7c; local_7c = local_7c - 1) {
        *(int *)((long)in_R9 + (ulong)local_7c * 4) =
             *(int *)((long)in_R9 + (ulong)local_7c * 4 + 0x400) +
             *(int *)((long)in_R9 + (ulong)local_7c * 4 + 0x800) +
             *(int *)((long)in_R9 + (ulong)local_7c * 4 + 0xc00) +
             *(int *)((long)in_R9 + (ulong)local_7c * 4);
        if (*(int *)((long)in_R9 + (ulong)local_7c * 4) != 0) {
          return 0xffffffffffffffd0;
        }
      }
    }
    if (0xff < local_4c) {
      local_4c = 0xff;
    }
    for (local_80 = 0; local_80 <= local_4c; local_80 = local_80 + 1) {
      *(int *)((long)in_RDI + (ulong)local_80 * 4) =
           *(int *)((long)in_R9 + (ulong)local_80 * 4) +
           *(int *)((long)in_R9 + (ulong)local_80 * 4 + 0x400) +
           *(int *)((long)in_R9 + (ulong)local_80 * 4 + 0x800) +
           *(int *)((long)in_R9 + (ulong)local_80 * 4 + 0xc00);
      if (local_50 < *(uint *)((long)in_RDI + (ulong)local_80 * 4)) {
        local_50 = *(uint *)((long)in_RDI + (ulong)local_80 * 4);
      }
    }
    while (*(int *)((long)in_RDI + (ulong)local_4c * 4) == 0) {
      local_4c = local_4c - 1;
    }
    *in_RSI = local_4c;
    local_8 = (ulong)local_50;
  }
  return local_8;
}

Assistant:

static size_t FSE_count_parallel_wksp(
                                unsigned* count, unsigned* maxSymbolValuePtr,
                                const void* source, size_t sourceSize,
                                unsigned checkMax, unsigned* const workSpace)
{
    const BYTE* ip = (const BYTE*)source;
    const BYTE* const iend = ip+sourceSize;
    unsigned maxSymbolValue = *maxSymbolValuePtr;
    unsigned max=0;
    U32* const Counting1 = workSpace;
    U32* const Counting2 = Counting1 + 256;
    U32* const Counting3 = Counting2 + 256;
    U32* const Counting4 = Counting3 + 256;

    memset(workSpace, 0, 4*256*sizeof(unsigned));

    /* safety checks */
    if (!sourceSize) {
        memset(count, 0, maxSymbolValue + 1);
        *maxSymbolValuePtr = 0;
        return 0;
    }
    if (!maxSymbolValue) maxSymbolValue = 255;            /* 0 == default */

    /* by stripes of 16 bytes */
    {   U32 cached = MEM_read32(ip); ip += 4;
        while (ip < iend-15) {
            U32 c = cached; cached = MEM_read32(ip); ip += 4;
            Counting1[(BYTE) c     ]++;
            Counting2[(BYTE)(c>>8) ]++;
            Counting3[(BYTE)(c>>16)]++;
            Counting4[       c>>24 ]++;
            c = cached; cached = MEM_read32(ip); ip += 4;
            Counting1[(BYTE) c     ]++;
            Counting2[(BYTE)(c>>8) ]++;
            Counting3[(BYTE)(c>>16)]++;
            Counting4[       c>>24 ]++;
            c = cached; cached = MEM_read32(ip); ip += 4;
            Counting1[(BYTE) c     ]++;
            Counting2[(BYTE)(c>>8) ]++;
            Counting3[(BYTE)(c>>16)]++;
            Counting4[       c>>24 ]++;
            c = cached; cached = MEM_read32(ip); ip += 4;
            Counting1[(BYTE) c     ]++;
            Counting2[(BYTE)(c>>8) ]++;
            Counting3[(BYTE)(c>>16)]++;
            Counting4[       c>>24 ]++;
        }
        ip-=4;
    }

    /* finish last symbols */
    while (ip<iend) Counting1[*ip++]++;

    if (checkMax) {   /* verify stats will fit into destination table */
        U32 s; for (s=255; s>maxSymbolValue; s--) {
            Counting1[s] += Counting2[s] + Counting3[s] + Counting4[s];
            if (Counting1[s]) return ERROR(maxSymbolValue_tooSmall);
    }   }

    {   U32 s;
        if (maxSymbolValue > 255) maxSymbolValue = 255;
        for (s=0; s<=maxSymbolValue; s++) {
            count[s] = Counting1[s] + Counting2[s] + Counting3[s] + Counting4[s];
            if (count[s] > max) max = count[s];
    }   }

    while (!count[maxSymbolValue]) maxSymbolValue--;
    *maxSymbolValuePtr = maxSymbolValue;
    return (size_t)max;
}